

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eltwise.cpp
# Opt level: O3

int __thiscall
ncnn::Eltwise::forward
          (Eltwise *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  float fVar1;
  undefined8 uVar2;
  int iVar3;
  int _h;
  uint _c;
  pointer pMVar4;
  Mat *this_00;
  size_t sVar5;
  pointer pMVar6;
  size_t sVar7;
  size_t sVar8;
  size_t sVar9;
  size_t sVar10;
  size_t sVar11;
  undefined8 *puVar12;
  void *pvVar13;
  uint uVar14;
  ulong uVar15;
  void *pvVar16;
  void *pvVar17;
  ulong uVar18;
  ulong uVar19;
  ulong uVar20;
  ulong uVar21;
  float fVar22;
  
  pMVar4 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
           super__Vector_impl_data._M_start;
  iVar3 = pMVar4->w;
  _h = pMVar4->h;
  _c = pMVar4->c;
  uVar21 = (ulong)_c;
  this_00 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
            super__Vector_impl_data._M_start;
  Mat::create(this_00,iVar3,_h,_c,pMVar4->elemsize,opt->blob_allocator);
  pvVar13 = this_00->data;
  if (pvVar13 == (void *)0x0) {
    return -100;
  }
  sVar5 = this_00->cstep;
  if ((long)this_00->c * sVar5 == 0) {
    return -100;
  }
  uVar14 = _h * iVar3;
  iVar3 = this->op_type;
  if (iVar3 == 2) {
    pMVar6 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
             super__Vector_impl_data._M_start;
    if (0 < (int)_c) {
      pvVar16 = pMVar4->data;
      sVar7 = pMVar4->cstep;
      pvVar17 = pMVar6[1].data;
      sVar8 = pMVar6[1].cstep;
      sVar9 = this_00->elemsize;
      sVar10 = pMVar6[1].elemsize;
      sVar11 = pMVar4->elemsize;
      uVar18 = 0;
      do {
        if (0 < (int)uVar14) {
          uVar15 = 0;
          do {
            fVar22 = *(float *)((long)pvVar17 + uVar15 * 4);
            fVar1 = *(float *)((long)pvVar16 + uVar15 * 4);
            if (fVar22 <= fVar1) {
              fVar22 = fVar1;
            }
            *(float *)((long)pvVar13 + uVar15 * 4) = fVar22;
            uVar15 = uVar15 + 1;
          } while (uVar14 != uVar15);
        }
        uVar18 = uVar18 + 1;
        pvVar13 = (void *)((long)pvVar13 + sVar9 * sVar5);
        pvVar17 = (void *)((long)pvVar17 + sVar8 * sVar10);
        pvVar16 = (void *)((long)pvVar16 + sVar7 * sVar11);
      } while (uVar18 != uVar21);
    }
    uVar18 = (long)(bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl
                   .super__Vector_impl_data._M_finish - (long)pMVar6 >> 6;
    if (uVar18 < 3) {
      return 0;
    }
    uVar15 = 2;
    do {
      if (0 < (int)_c) {
        pvVar13 = pMVar6[uVar15].data;
        sVar7 = pMVar6[uVar15].cstep;
        sVar8 = pMVar6[uVar15].elemsize;
        pvVar16 = this_00->data;
        sVar9 = this_00->elemsize;
        uVar19 = 0;
        do {
          if (0 < (int)uVar14) {
            uVar20 = 0;
            do {
              fVar22 = *(float *)((long)pvVar13 + uVar20 * 4);
              fVar1 = *(float *)((long)pvVar16 + uVar20 * 4);
              if (fVar22 <= fVar1) {
                fVar22 = fVar1;
              }
              *(float *)((long)pvVar16 + uVar20 * 4) = fVar22;
              uVar20 = uVar20 + 1;
            } while (uVar14 != uVar20);
          }
          uVar19 = uVar19 + 1;
          pvVar13 = (void *)((long)pvVar13 + sVar7 * sVar8);
          pvVar16 = (void *)((long)pvVar16 + sVar9 * sVar5);
        } while (uVar19 != uVar21);
      }
      uVar15 = uVar15 + 1;
    } while (uVar15 != uVar18);
  }
  else {
    if (iVar3 == 1) {
      if ((this->coeffs).w != 0) {
        puVar12 = (undefined8 *)(this->coeffs).data;
        pMVar6 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        if (0 < (int)_c) {
          uVar2 = *puVar12;
          pvVar16 = pMVar4->data;
          sVar7 = pMVar4->cstep;
          pvVar17 = pMVar6[1].data;
          sVar8 = pMVar6[1].cstep;
          sVar9 = this_00->elemsize;
          sVar10 = pMVar6[1].elemsize;
          sVar11 = pMVar4->elemsize;
          uVar18 = 0;
          do {
            if (0 < (int)uVar14) {
              uVar15 = 0;
              do {
                *(float *)((long)pvVar13 + uVar15 * 4) =
                     *(float *)((long)pvVar17 + uVar15 * 4) * (float)((ulong)uVar2 >> 0x20) +
                     *(float *)((long)pvVar16 + uVar15 * 4) * (float)uVar2;
                uVar15 = uVar15 + 1;
              } while (uVar14 != uVar15);
            }
            uVar18 = uVar18 + 1;
            pvVar13 = (void *)((long)pvVar13 + sVar9 * sVar5);
            pvVar17 = (void *)((long)pvVar17 + sVar8 * sVar10);
            pvVar16 = (void *)((long)pvVar16 + sVar7 * sVar11);
          } while (uVar18 != uVar21);
        }
        uVar18 = (long)(bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                       _M_impl.super__Vector_impl_data._M_finish - (long)pMVar6 >> 6;
        if (uVar18 < 3) {
          return 0;
        }
        uVar15 = 2;
        do {
          if (0 < (int)_c) {
            fVar22 = *(float *)((long)puVar12 + (long)(int)uVar15 * 4);
            pvVar13 = pMVar6[uVar15].data;
            sVar7 = pMVar6[uVar15].cstep;
            sVar8 = pMVar6[uVar15].elemsize;
            pvVar16 = this_00->data;
            sVar9 = this_00->elemsize;
            uVar19 = 0;
            do {
              if (0 < (int)uVar14) {
                uVar20 = 0;
                do {
                  *(float *)((long)pvVar16 + uVar20 * 4) =
                       *(float *)((long)pvVar13 + uVar20 * 4) * fVar22 +
                       *(float *)((long)pvVar16 + uVar20 * 4);
                  uVar20 = uVar20 + 1;
                } while (uVar14 != uVar20);
              }
              uVar19 = uVar19 + 1;
              pvVar16 = (void *)((long)pvVar16 + sVar9 * sVar5);
              pvVar13 = (void *)((long)pvVar13 + sVar7 * sVar8);
            } while (uVar19 != uVar21);
          }
          uVar15 = uVar15 + 1;
        } while (uVar15 != uVar18);
        return 0;
      }
      pMVar6 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
               super__Vector_impl_data._M_start;
      if (0 < (int)_c) {
        pvVar16 = pMVar4->data;
        sVar7 = pMVar4->cstep;
        pvVar17 = pMVar6[1].data;
        sVar8 = pMVar6[1].cstep;
        sVar9 = this_00->elemsize;
        sVar10 = pMVar6[1].elemsize;
        sVar11 = pMVar4->elemsize;
        uVar18 = 0;
        do {
          if (0 < (int)uVar14) {
            uVar15 = 0;
            do {
              *(float *)((long)pvVar13 + uVar15 * 4) =
                   *(float *)((long)pvVar17 + uVar15 * 4) + *(float *)((long)pvVar16 + uVar15 * 4);
              uVar15 = uVar15 + 1;
            } while (uVar14 != uVar15);
          }
          uVar18 = uVar18 + 1;
          pvVar13 = (void *)((long)pvVar13 + sVar9 * sVar5);
          pvVar17 = (void *)((long)pvVar17 + sVar8 * sVar10);
          pvVar16 = (void *)((long)pvVar16 + sVar7 * sVar11);
        } while (uVar18 != uVar21);
      }
      uVar18 = (long)(bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                     _M_impl.super__Vector_impl_data._M_finish - (long)pMVar6 >> 6;
      if (uVar18 < 3) {
        return 0;
      }
      uVar15 = 2;
      do {
        if (0 < (int)_c) {
          pvVar13 = pMVar6[uVar15].data;
          sVar7 = pMVar6[uVar15].cstep;
          sVar8 = pMVar6[uVar15].elemsize;
          pvVar16 = this_00->data;
          sVar9 = this_00->elemsize;
          uVar19 = 0;
          do {
            if (0 < (int)uVar14) {
              uVar20 = 0;
              do {
                *(float *)((long)pvVar16 + uVar20 * 4) =
                     *(float *)((long)pvVar16 + uVar20 * 4) + *(float *)((long)pvVar13 + uVar20 * 4)
                ;
                uVar20 = uVar20 + 1;
              } while (uVar14 != uVar20);
            }
            uVar19 = uVar19 + 1;
            pvVar16 = (void *)((long)pvVar16 + sVar9 * sVar5);
            pvVar13 = (void *)((long)pvVar13 + sVar7 * sVar8);
          } while (uVar19 != uVar21);
        }
        uVar15 = uVar15 + 1;
      } while (uVar15 != uVar18);
      return 0;
    }
    if (iVar3 != 0) {
      return 0;
    }
    pMVar6 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
             super__Vector_impl_data._M_start;
    if (0 < (int)_c) {
      pvVar16 = pMVar4->data;
      sVar7 = pMVar4->cstep;
      pvVar17 = pMVar6[1].data;
      sVar8 = pMVar6[1].cstep;
      sVar9 = this_00->elemsize;
      sVar10 = pMVar6[1].elemsize;
      sVar11 = pMVar4->elemsize;
      uVar18 = 0;
      do {
        if (0 < (int)uVar14) {
          uVar15 = 0;
          do {
            *(float *)((long)pvVar13 + uVar15 * 4) =
                 *(float *)((long)pvVar17 + uVar15 * 4) * *(float *)((long)pvVar16 + uVar15 * 4);
            uVar15 = uVar15 + 1;
          } while (uVar14 != uVar15);
        }
        uVar18 = uVar18 + 1;
        pvVar13 = (void *)((long)pvVar13 + sVar9 * sVar5);
        pvVar17 = (void *)((long)pvVar17 + sVar8 * sVar10);
        pvVar16 = (void *)((long)pvVar16 + sVar7 * sVar11);
      } while (uVar18 != uVar21);
    }
    uVar18 = (long)(bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl
                   .super__Vector_impl_data._M_finish - (long)pMVar6 >> 6;
    if (uVar18 < 3) {
      return 0;
    }
    uVar15 = 2;
    do {
      if (0 < (int)_c) {
        pvVar13 = pMVar6[uVar15].data;
        sVar7 = pMVar6[uVar15].cstep;
        sVar8 = pMVar6[uVar15].elemsize;
        pvVar16 = this_00->data;
        sVar9 = this_00->elemsize;
        uVar19 = 0;
        do {
          if (0 < (int)uVar14) {
            uVar20 = 0;
            do {
              *(float *)((long)pvVar16 + uVar20 * 4) =
                   *(float *)((long)pvVar16 + uVar20 * 4) * *(float *)((long)pvVar13 + uVar20 * 4);
              uVar20 = uVar20 + 1;
            } while (uVar14 != uVar20);
          }
          uVar19 = uVar19 + 1;
          pvVar16 = (void *)((long)pvVar16 + sVar9 * sVar5);
          pvVar13 = (void *)((long)pvVar13 + sVar7 * sVar8);
        } while (uVar19 != uVar21);
      }
      uVar15 = uVar15 + 1;
    } while (uVar15 != uVar18);
  }
  return 0;
}

Assistant:

int Eltwise::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    const Mat& bottom_blob = bottom_blobs[0];
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int channels = bottom_blob.c;
    size_t elemsize = bottom_blob.elemsize;
    int size = w * h;

    Mat& top_blob = top_blobs[0];
    top_blob.create(w, h, channels, elemsize, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    if (op_type == Operation_PROD)
    {
        // first blob
        const Mat& bottom_blob1 = bottom_blobs[1];
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q=0; q<channels; q++)
        {
            const float* ptr = bottom_blob.channel(q);
            const float* ptr1 = bottom_blob1.channel(q);
            float* outptr = top_blob.channel(q);

            for (int i=0; i<size; i++)
            {
                outptr[i] = ptr[i] * ptr1[i];
            }
        }

        for (size_t b=2; b<bottom_blobs.size(); b++)
        {
            const Mat& bottom_blob1 = bottom_blobs[b];
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q=0; q<channels; q++)
            {
                const float* ptr = bottom_blob1.channel(q);
                float* outptr = top_blob.channel(q);

                for (int i=0; i<size; i++)
                {
                    outptr[i] *= ptr[i];
                }
            }
        }
    }
    else if (op_type == Operation_SUM)
    {
        if (coeffs.w == 0)
        {
            // first blob
            const Mat& bottom_blob1 = bottom_blobs[1];
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q=0; q<channels; q++)
            {
                const float* ptr = bottom_blob.channel(q);
                const float* ptr1 = bottom_blob1.channel(q);
                float* outptr = top_blob.channel(q);

                for (int i=0; i<size; i++)
                {
                    outptr[i] = ptr[i] + ptr1[i];
                }
            }

            for (size_t b=2; b<bottom_blobs.size(); b++)
            {
                const Mat& bottom_blob1 = bottom_blobs[b];
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q=0; q<channels; q++)
                {
                    const float* ptr = bottom_blob1.channel(q);
                    float* outptr = top_blob.channel(q);

                    for (int i=0; i<size; i++)
                    {
                        outptr[i] += ptr[i];
                    }
                }
            }
        }
        else
        {
            // first blob
            const Mat& bottom_blob1 = bottom_blobs[1];
            float coeff0 = coeffs[0];
            float coeff1 = coeffs[1];
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q=0; q<channels; q++)
            {
                const float* ptr = bottom_blob.channel(q);
                const float* ptr1 = bottom_blob1.channel(q);
                float* outptr = top_blob.channel(q);

                for (int i=0; i<size; i++)
                {
                    outptr[i] = ptr[i] * coeff0 + ptr1[i] * coeff1;
                }
            }

            for (size_t b=2; b<bottom_blobs.size(); b++)
            {
                const Mat& bottom_blob1 = bottom_blobs[b];
                float coeff = coeffs[b];
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q=0; q<channels; q++)
                {
                    const float* ptr = bottom_blob1.channel(q);
                    float* outptr = top_blob.channel(q);

                    for (int i=0; i<size; i++)
                    {
                        outptr[i] += ptr[i] * coeff;
                    }
                }
            }
        }
    }
    else if (op_type == Operation_MAX)
    {
        // first blob
        const Mat& bottom_blob1 = bottom_blobs[1];
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q=0; q<channels; q++)
        {
            const float* ptr = bottom_blob.channel(q);
            const float* ptr1 = bottom_blob1.channel(q);
            float* outptr = top_blob.channel(q);

            for (int i=0; i<size; i++)
            {
                outptr[i] = std::max(ptr[i], ptr1[i]);
            }
        }

        for (size_t b=2; b<bottom_blobs.size(); b++)
        {
            const Mat& bottom_blob1 = bottom_blobs[b];
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q=0; q<channels; q++)
            {
                const float* ptr = bottom_blob1.channel(q);
                float* outptr = top_blob.channel(q);

                for (int i=0; i<size; i++)
                {
                    outptr[i] = std::max(outptr[i], ptr[i]);
                }
            }
        }
    }

    return 0;
}